

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O2

void __thiscall amrex::MLMG::makeSolvable(MLMG *this,int amrlev,int mglev,Any *mf)

{
  ostream *os_;
  Print *pPVar1;
  ostringstream *this_00;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  _Vector_base<double,_std::allocator<double>_> local_1e0;
  MLMG *local_1c8;
  Any *local_1c0;
  Print local_1b8;
  
  local_1c0 = mf;
  (*this->linop->_vptr_MLLinOp[0x1b])(&local_1e0,this->linop,(ulong)(uint)amrlev);
  local_1c8 = this;
  if (3 < this->verbose) {
    uVar3 = (ulong)((long)local_1e0._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1e0._M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar2 = 0;
    uVar4 = uVar3 & 0xffffffff;
    if ((int)uVar3 < 1) {
      uVar4 = uVar2;
    }
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      os_ = OutStream();
      Print::Print(&local_1b8,os_);
      std::operator<<((ostream *)&local_1b8.ss,"MLMG: Subtracting ");
      pPVar1 = Print::operator<<(&local_1b8,
                                 (double *)
                                 ((long)local_1e0._M_impl.super__Vector_impl_data._M_start + uVar2))
      ;
      this_00 = &pPVar1->ss;
      std::operator<<((ostream *)this_00," from mf component c = ");
      std::ostream::operator<<(this_00,(int)uVar3);
      std::operator<<((ostream *)this_00," on level (");
      std::ostream::operator<<(this_00,amrlev);
      std::operator<<((ostream *)this_00,", ");
      std::ostream::operator<<(this_00,mglev);
      std::operator<<((ostream *)this_00,")\n");
      Print::~Print(&local_1b8);
      uVar2 = uVar2 + 8;
    }
  }
  (*local_1c8->linop->_vptr_MLLinOp[0x1c])
            (local_1c8->linop,(ulong)(uint)amrlev,(ulong)(uint)mglev,local_1c0,&local_1e0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1e0);
  return;
}

Assistant:

void
MLMG::makeSolvable (int amrlev, int mglev, Any& mf)
{
    auto const& offset = linop.getSolvabilityOffset(amrlev, mglev, mf);
    if (verbose >= 4) {
        const int ncomp = offset.size();
        for (int c = 0; c < ncomp; ++c) {
            amrex::Print() << "MLMG: Subtracting " << offset[c]
                           << " from mf component c = " << c
                           << " on level (" << amrlev << ", " << mglev << ")\n";
        }
    }
    linop.fixSolvabilityByOffset(amrlev, mglev, mf, offset);
}